

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSetSourceFilesPropertiesCommand.cxx
# Opt level: O1

bool cmSetSourceFilesPropertiesCommand
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,cmExecutionStatus *status)

{
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __first1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __last1;
  pointer pbVar1;
  const_iterator cVar2;
  bool bVar3;
  int iVar4;
  undefined8 uVar5;
  cmSourceFile *sf;
  undefined8 extraout_RAX;
  undefined8 uVar6;
  char *pcVar7;
  undefined4 uVar8;
  string_view *__it;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  pointer sourceName;
  byte bVar9;
  ulong uVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  string *prop;
  pointer_____offset_0x10___ *__it_00;
  byte bVar12;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  options_it;
  string errors;
  vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> source_file_directory_makefiles;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_target_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  source_file_directories;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  files;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_148;
  string *local_140;
  cmExecutionStatus *local_138;
  string *local_130;
  undefined4 local_124;
  cmMakefile *local_120;
  basic_string_view<char,_std::char_traits<char>_> local_118;
  size_type local_108;
  pointer local_100;
  undefined8 local_f8;
  char *local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_e8;
  const_iterator local_e0;
  undefined1 local_d8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  long local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_98;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  __first1._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start;
  __last1._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_138 = status;
  if ((ulong)((long)__last1._M_current - (long)__first1._M_current) < 0x21) {
    local_118._M_len = (size_t)&local_108;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"called with incorrect number of arguments","");
    std::__cxx11::string::_M_assign((string *)&local_138->Error);
    if ((size_type *)local_118._M_len != &local_108) {
      operator_delete((void *)local_118._M_len,local_108 + 1);
    }
    bVar12 = 0;
  }
  else {
    local_148 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                std::
                find_first_of<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::basic_string_view<char,std::char_traits<char>>const*>
                          (__first1,__last1,cmSetSourceFilesPropertiesCommand::prop_names,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           &(anonymous_namespace)::json_error::typeinfo);
    iVar4 = 0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_98.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_a8 = 0;
    local_b8._M_allocated_capacity = 0;
    local_b8._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_e8 = args;
    local_e0._M_current = local_148;
    if (local_148 ==
        (args->
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )._M_impl.super__Vector_impl_data._M_finish) {
      bVar12 = 0;
      bVar9 = 0;
    }
    else {
      local_140 = (string *)&local_138->Error;
      local_130 = (string *)0x0;
      local_120 = (cmMakefile *)0x0;
      do {
        uVar5 = std::__cxx11::string::compare((char *)local_148);
        if ((int)uVar5 == 0) {
          local_130 = (string *)CONCAT71((int7)((ulong)uVar5 >> 8),1);
          iVar4 = 1;
        }
        else {
          uVar5 = std::__cxx11::string::compare((char *)local_148);
          if ((int)uVar5 == 0) {
            local_120 = (cmMakefile *)CONCAT71((int7)((ulong)uVar5 >> 8),1);
            iVar4 = 2;
          }
          else {
            uVar10 = 3;
            __it = cmSetSourceFilesPropertiesCommand::prop_names;
            local_118._M_len = (size_t)&local_148;
            do {
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<cmSetSourceFilesPropertiesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::$_0::operator()(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)const::{lambda(std::basic_string_view<char,std::char_traits<char>>)#1}>
                      ::operator()((_Iter_pred<cmSetSourceFilesPropertiesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0::operator()(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)const::_lambda(std::basic_string_view<char,std::char_traits<char>>)_1_>
                                    *)&local_118,__it);
              __it_00 = (pointer_____offset_0x10___ *)__it;
              if (bVar3) goto LAB_0034f199;
              __it_00 = (pointer_____offset_0x10___ *)(__it + 1);
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<cmSetSourceFilesPropertiesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::$_0::operator()(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)const::{lambda(std::basic_string_view<char,std::char_traits<char>>)#1}>
                      ::operator()((_Iter_pred<cmSetSourceFilesPropertiesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0::operator()(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)const::_lambda(std::basic_string_view<char,std::char_traits<char>>)_1_>
                                    *)&local_118,
                                   (basic_string_view<char,_std::char_traits<char>_> *)__it_00);
              if (bVar3) goto LAB_0034f199;
              __it_00 = (pointer_____offset_0x10___ *)(__it + 2);
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<cmSetSourceFilesPropertiesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::$_0::operator()(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)const::{lambda(std::basic_string_view<char,std::char_traits<char>>)#1}>
                      ::operator()((_Iter_pred<cmSetSourceFilesPropertiesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0::operator()(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)const::_lambda(std::basic_string_view<char,std::char_traits<char>>)_1_>
                                    *)&local_118,
                                   (basic_string_view<char,_std::char_traits<char>_> *)__it_00);
              if (bVar3) goto LAB_0034f199;
              __it_00 = (pointer_____offset_0x10___ *)(__it + 3);
              bVar3 = __gnu_cxx::__ops::
                      _Iter_pred<cmSetSourceFilesPropertiesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::$_0::operator()(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)const::{lambda(std::basic_string_view<char,std::char_traits<char>>)#1}>
                      ::operator()((_Iter_pred<cmSetSourceFilesPropertiesCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,cmExecutionStatus&)::__0::operator()(__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>const&)const::_lambda(std::basic_string_view<char,std::char_traits<char>>)_1_>
                                    *)&local_118,
                                   (basic_string_view<char,_std::char_traits<char>_> *)__it_00);
              if (bVar3) goto LAB_0034f199;
              __it = __it + 4;
              uVar10 = uVar10 - 1;
            } while (1 < uVar10);
            __it_00 = &(anonymous_namespace)::json_error::typeinfo;
LAB_0034f199:
            args = local_e8;
            if (__it_00 != &(anonymous_namespace)::json_error::typeinfo) break;
            if (iVar4 == 2) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_98,local_148);
              iVar4 = 2;
            }
            else if (iVar4 == 1) {
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::push_back(&local_78,local_148);
              iVar4 = 1;
            }
            else {
              local_100 = (local_148->_M_dataplus)._M_p;
              local_108 = local_148->_M_string_length;
              local_118._M_len = 0x18;
              local_118._M_str = "given invalid argument \"";
              local_f8 = 2;
              local_f0 = "\".";
              views._M_len = 3;
              views._M_array = &local_118;
              cmCatViews_abi_cxx11_((string *)local_d8,views);
              std::__cxx11::string::_M_assign(local_140);
              if ((string *)local_d8._0_8_ != (string *)(local_d8 + 0x10)) {
                operator_delete((void *)local_d8._0_8_,local_d8._16_8_ + 1);
              }
            }
          }
        }
        local_148 = local_148 + 1;
      } while (local_148 !=
               (args->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish);
      bVar12 = (byte)local_120;
      bVar9 = (byte)local_130;
    }
    pbVar11 = local_148;
    bVar3 = SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes
                      (local_138,(bool)(bVar9 & 1),(bool)(bVar12 & 1),&local_78,&local_98,
                       (vector<cmMakefile_*,_std::allocator<cmMakefile_*>_> *)&local_b8);
    if (bVar3) {
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
      local_48.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SetPropertyCommand::MakeSourceFilePathsAbsoluteIfNeeded
                (local_138,&local_48,
                 (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start,local_e0,(bool)((bVar12 | bVar9) & 1));
      local_118._M_len = (size_t)&local_108;
      local_118._M_str = (char *)0x0;
      local_108 = local_108 & 0xffffffffffffff00;
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8._8_8_
      ;
      local_124 = (undefined4)
                  CONCAT71((int7)((ulong)local_b8._8_8_ >> 8),
                           local_b8._M_allocated_capacity == local_b8._8_8_);
      if (local_b8._M_allocated_capacity != local_b8._8_8_) {
        local_58 = pbVar11;
        local_138 = (cmExecutionStatus *)&local_138->Error;
        uVar5 = local_b8._M_allocated_capacity;
        do {
          sourceName = local_48.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
          local_120 = (cmMakefile *)
                      (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5)
                      ->_M_dataplus)._M_p;
          local_130 = local_48.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          pbVar1 = (local_e8->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish;
          local_d8._0_8_ = (string *)0x0;
          local_d8._8_8_ = (string *)0x0;
          local_d8._16_8_ = 0;
          local_140 = (string *)CONCAT71((int7)((ulong)local_e8 >> 8),1);
          local_e0._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5;
          for (pbVar11 = local_58; pbVar11 != pbVar1; pbVar11 = pbVar11 + 1) {
            iVar4 = std::__cxx11::string::compare((char *)pbVar11);
            if (((iVar4 != 0) &&
                (iVar4 = std::__cxx11::string::compare((char *)pbVar11), iVar4 != 0)) &&
               (iVar4 = std::__cxx11::string::compare((char *)pbVar11), iVar4 != 0)) {
              iVar4 = std::__cxx11::string::compare((char *)pbVar11);
              if (iVar4 == 0) {
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<char_const(&)[14]>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           local_d8,(char (*) [14])0x71969e);
                pbVar11 = pbVar11 + 1;
                if (pbVar11 != pbVar1) {
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)local_d8,pbVar11);
                  goto LAB_0034f470;
                }
                pcVar7 = "called with incorrect number of arguments COMPILE_FLAGS with no flags";
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)pbVar11);
                if (iVar4 == 0) {
                  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                  emplace_back<char_const(&)[15]>
                            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                             local_d8,(char (*) [15])"OBJECT_DEPENDS");
                  pbVar11 = pbVar11 + 1;
                  if (pbVar11 != pbVar1) {
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)local_d8,pbVar11);
                    goto LAB_0034f470;
                  }
                  pcVar7 = 
                  "called with incorrect number of arguments OBJECT_DEPENDS with no dependencies";
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)pbVar11);
                  pcVar7 = "called with illegal arguments, maybe missing a PROPERTIES specifier?";
                  if (iVar4 == 0) {
                    if (((int)pbVar1 - (int)(pbVar11 + 1) & 0x20U) == 0) {
                      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                      _M_range_insert<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>
                                  *)local_d8,local_d8._8_8_,pbVar11 + 1,pbVar1,0x44);
                    }
                    else {
                      local_140 = (string *)0x0;
                      std::__cxx11::string::_M_replace
                                ((ulong)&local_118,0,local_118._M_str,0x713448);
                    }
                    break;
                  }
                }
              }
              local_140 = (string *)0x0;
              std::__cxx11::string::_M_replace((ulong)&local_118,0,local_118._M_str,(ulong)pcVar7);
              break;
            }
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string_const&>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_d8
                       ,pbVar11);
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<char_const(&)[2]>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_d8
                       ,(char (*) [2])0x769158);
LAB_0034f470:
          }
          if ((sourceName != local_130 & (byte)local_140) == 1) {
            do {
              sf = cmMakefile::GetOrCreateSource(local_120,sourceName,false,Ambiguous);
              prop = (string *)local_d8._0_8_;
              if (sf != (cmSourceFile *)0x0) {
                for (; prop != (string *)local_d8._8_8_; prop = prop + 2) {
                  if ((prop->_M_string_length == 9) &&
                     (iVar4 = bcmp((prop->_M_dataplus)._M_p,"GENERATED",9), iVar4 == 0)) {
                    SetPropertyCommand::HandleAndValidateSourceFilePropertyGENERATED
                              (sf,prop + 1,Set);
                  }
                  else {
                    cmSourceFile::SetProperty(sf,prop,prop + 1);
                  }
                }
              }
              sourceName = sourceName + 1;
            } while (sourceName != local_130);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_d8);
          cVar2._M_current = local_e0._M_current;
          uVar6 = extraout_RAX;
          if ((byte)local_140 == '\0') {
            uVar6 = std::__cxx11::string::_M_assign((string *)local_138);
            if ((byte)local_140 == '\0') break;
          }
          uVar5 = &(cVar2._M_current)->_M_string_length;
          local_124 = (undefined4)
                      CONCAT71((int7)((ulong)uVar6 >> 8),
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               uVar5 == local_50);
        } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5 !=
                 local_50);
      }
      if ((size_type *)local_118._M_len != &local_108) {
        operator_delete((void *)local_118._M_len,local_108 + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_48);
      uVar8 = local_124;
    }
    else {
      uVar8 = 0;
    }
    bVar12 = (byte)uVar8;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_b8._M_allocated_capacity !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      operator_delete((void *)local_b8._M_allocated_capacity,local_a8 - local_b8._0_8_);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_98);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_78);
  }
  return (bool)(bVar12 & 1);
}

Assistant:

bool cmSetSourceFilesPropertiesCommand(std::vector<std::string> const& args,
                                       cmExecutionStatus& status)
{
  if (args.size() < 2) {
    status.SetError("called with incorrect number of arguments");
    return false;
  }

  // break the arguments into source file names and properties
  // old style allows for specifier before PROPERTIES keyword
  static const cm::string_view prop_names[] = {
    "ABSTRACT",       "GENERATED",  "WRAP_EXCLUDE", "COMPILE_FLAGS",
    "OBJECT_DEPENDS", "PROPERTIES", "DIRECTORY",    "TARGET_DIRECTORY"
  };

  auto isAPropertyKeyword =
    [](const std::vector<std::string>::const_iterator& arg_it) {
      return std::any_of(
        std::begin(prop_names), std::end(prop_names),
        [&arg_it](cm::string_view prop_name) { return *arg_it == prop_name; });
    };

  auto options_begin = std::find_first_of(
    args.begin(), args.end(), std::begin(prop_names), std::end(prop_names));
  auto options_it = options_begin;

  // Handle directory options.
  std::vector<std::string> source_file_directories;
  std::vector<std::string> source_file_target_directories;
  bool source_file_directory_option_enabled = false;
  bool source_file_target_option_enabled = false;
  std::vector<cmMakefile*> source_file_directory_makefiles;

  enum Doing
  {
    DoingNone,
    DoingSourceDirectory,
    DoingSourceTargetDirectory
  };
  Doing doing = DoingNone;
  for (; options_it != args.end(); ++options_it) {
    if (*options_it == "DIRECTORY") {
      doing = DoingSourceDirectory;
      source_file_directory_option_enabled = true;
    } else if (*options_it == "TARGET_DIRECTORY") {
      doing = DoingSourceTargetDirectory;
      source_file_target_option_enabled = true;
    } else if (isAPropertyKeyword(options_it)) {
      break;
    } else if (doing == DoingSourceDirectory) {
      source_file_directories.push_back(*options_it);
    } else if (doing == DoingSourceTargetDirectory) {
      source_file_target_directories.push_back(*options_it);
    } else {
      status.SetError(
        cmStrCat("given invalid argument \"", *options_it, "\"."));
    }
  }

  const auto props_begin = options_it;

  bool file_scopes_handled =
    SetPropertyCommand::HandleAndValidateSourceFileDirectoryScopes(
      status, source_file_directory_option_enabled,
      source_file_target_option_enabled, source_file_directories,
      source_file_target_directories, source_file_directory_makefiles);
  if (!file_scopes_handled) {
    return false;
  }

  std::vector<std::string> files;
  bool source_file_paths_should_be_absolute =
    source_file_directory_option_enabled || source_file_target_option_enabled;
  SetPropertyCommand::MakeSourceFilePathsAbsoluteIfNeeded(
    status, files, args.begin(), options_begin,
    source_file_paths_should_be_absolute);

  // Now call the worker function for each directory scope represented by a
  // cmMakefile instance.
  std::string errors;
  for (auto* const mf : source_file_directory_makefiles) {
    bool ret = RunCommandForScope(mf, files.begin(), files.end(), props_begin,
                                  args.end(), errors);
    if (!ret) {
      status.SetError(errors);
      return ret;
    }
  }

  return true;
}